

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall rw::Light::destroy(Light *this)

{
  Light *this_local;
  
  PluginList::destruct((PluginList *)&s_plglist,this);
  setFrame(this,(Frame *)0x0);
  (*DAT_001685f8)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Light::destroy(void)
{
	s_plglist.destruct(this);
	assert(this->clump == nil);
	assert(this->world == nil);
	this->setFrame(nil);
	rwFree(this);
	numAllocated--;
}